

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O1

int sexp_check_type(sexp_conflict ctx,sexp_conflict a,sexp_conflict b)

{
  FILE *pFVar1;
  int *piVar2;
  int iVar3;
  
  if (((ulong)a & 3) == 0) {
    if (((((ulong)b & 3) == 0) && (b->tag == 1)) && (a->tag == (b->value).type.tag)) {
      return 1;
    }
    pFVar1 = (((ctx->value).type.setters)->value).port.stream;
    piVar2 = *(int **)(*(long *)(pFVar1->_shortbuf + (ulong)a->tag * 8 + -0x73) + 0x10);
    if ((((ulong)piVar2 & 3) == 0) && (*piVar2 == 10)) {
      if ((sexp_conflict)pFVar1->_IO_read_end == b) {
        return 1;
      }
      iVar3 = (int)(b->value).type.depth;
      if (piVar2[2] <= iVar3) {
        return 0;
      }
      return (int)(*(sexp_conflict *)(piVar2 + (long)iVar3 * 2 + 4) == b);
    }
  }
  return 0;
}

Assistant:

static int sexp_check_type(sexp ctx, sexp a, sexp b) {
  int d;
  sexp t, v;
  if (! sexp_pointerp(a))
    return 0;
  if (sexp_isa(a, b))
    return 1;
  t = sexp_object_type(ctx, a);
  v = sexp_type_cpl(t);
  if (! sexp_vectorp(v))
    return 0;
  if (b == sexp_type_by_index(ctx, SEXP_OBJECT))
    return 1;
  d = sexp_type_depth(b);
  return (d < (int)sexp_vector_length(v))
    && sexp_vector_ref(v, sexp_make_fixnum(d)) == b;
}